

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAlias.c
# Opt level: O0

char * CmdCommandAliasLookup(Abc_Frame_t *pAbc,char *sCommand)

{
  int iVar1;
  char *local_30;
  char *value;
  Abc_Alias *pAlias;
  char *sCommand_local;
  Abc_Frame_t *pAbc_local;
  
  pAlias = (Abc_Alias *)sCommand;
  sCommand_local = (char *)pAbc;
  iVar1 = st__lookup(pAbc->tAliases,sCommand,&local_30);
  if (iVar1 == 0) {
    pAbc_local = (Abc_Frame_t *)pAlias;
  }
  else {
    pAbc_local = (Abc_Frame_t *)**(undefined8 **)(local_30 + 0x10);
  }
  return (char *)pAbc_local;
}

Assistant:

char * CmdCommandAliasLookup( Abc_Frame_t * pAbc, char * sCommand )
{
  Abc_Alias * pAlias;
  char * value;
  if (! st__lookup( pAbc->tAliases, sCommand, &value)) 
    return sCommand;
  pAlias = (Abc_Alias *) value;
  return pAlias->argv[0];
}